

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O1

void test_single<unsigned_int>(void)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this;
  bool bVar3;
  ostringstream oss;
  ostringstream a;
  ostringstream b;
  write_int_to_stream<unsigned_int> local_4d8;
  undefined4 uStack_4d4;
  size_t local_4d0;
  undefined1 local_4c8 [20];
  write_int_to_stream<unsigned_int> local_4b4;
  write_int_to_stream<unsigned_int> local_4b0;
  write_int_to_stream<unsigned_int> local_4ac;
  write_int_to_stream<unsigned_int> local_4a8;
  write_int_to_stream<unsigned_int> local_4a4;
  write_int_to_stream<unsigned_int> local_4a0;
  write_int_to_stream<unsigned_int> local_49c;
  write_int_to_stream<unsigned_int> local_498;
  undefined4 uStack_494;
  size_t local_490;
  undefined1 local_488 [360];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_498.v = 0;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_498,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4d8.v = 0xffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4d8,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_49c.v = 1;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_49c,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4a0.v = 0;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4a0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4a4.v = 0xffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4a4,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4a8.v = 10;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4a8,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4ac.v = 0xfffffff6;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4ac,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4b0.v = 0x3039;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4b0,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  local_4b4.v = 0xffffcfc7;
  cppcms::impl::details::write_int_to_stream<unsigned_int>::operator()
            (&local_4b4,(ostream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  bVar3 = true;
  if (local_490 == local_4d0) {
    if (local_490 == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = bcmp((void *)CONCAT44(uStack_494,local_498.v),(void *)CONCAT44(uStack_4d4,local_4d8.v)
                   ,local_490);
      bVar3 = iVar1 != 0;
    }
  }
  if ((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v) != local_4c8) {
    operator_delete((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v));
  }
  if ((undefined1 *)CONCAT44(uStack_494,local_498.v) != local_488) {
    operator_delete((undefined1 *)CONCAT44(uStack_494,local_498.v));
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error!!! \n   ",0xd);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)CONCAT44(uStack_494,local_498.v),local_490);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n   ",4);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)CONCAT44(uStack_4d4,local_4d8.v),local_4d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v) != local_4c8) {
      operator_delete((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v));
    }
    if ((undefined1 *)CONCAT44(uStack_494,local_498.v) != local_488) {
      operator_delete((undefined1 *)CONCAT44(uStack_494,local_498.v));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    if (local_490 == local_4d0) {
      if (local_490 == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp((void *)CONCAT44(uStack_494,local_498.v),
                     (void *)CONCAT44(uStack_4d4,local_4d8.v),local_490);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v) != local_4c8) {
      operator_delete((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v));
    }
    if ((undefined1 *)CONCAT44(uStack_494,local_498.v) != local_488) {
      operator_delete((undefined1 *)CONCAT44(uStack_494,local_498.v));
    }
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,":",1);
      poVar2 = (ostream *)std::ostream::operator<<(&local_498,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," a.str() == b.str()",0x13);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)&local_4d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok       \n   ",0xd);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)CONCAT44(uStack_494,local_498.v),local_490);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n   ",4);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)CONCAT44(uStack_4d4,local_4d8.v),local_4d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v) != local_4c8) {
      operator_delete((undefined1 *)CONCAT44(uStack_4d4,local_4d8.v));
    }
    if ((undefined1 *)CONCAT44(uStack_494,local_498.v) != local_488) {
      operator_delete((undefined1 *)CONCAT44(uStack_494,local_498.v));
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}